

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URDFDocument.cpp
# Opt level: O1

bool __thiscall iDynTree::URDFDocument::documentHasBeenParsed(URDFDocument *this)

{
  Model *this_00;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::MaterialElement::MaterialInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::MaterialElement::MaterialInfo>_>_>
  *materialDatabase;
  ostream *poVar1;
  _Hash_node_base *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  pointer psVar4;
  element_type *peVar5;
  char cVar6;
  bool bVar7;
  int iVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  long *plVar11;
  ulong uVar12;
  iterator iVar13;
  ostream *poVar14;
  SensorsList *pSVar15;
  undefined4 extraout_var;
  Sensor *pSVar16;
  ModelSolidShapes *pMVar17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  long lVar18;
  uint uVar19;
  _Hash_node_base *p_Var20;
  shared_ptr<iDynTree::SensorHelper> *sensorHelper;
  pointer psVar21;
  bool bVar22;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rootCandidates;
  string baseLinkName;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  childLinks;
  Model newModel;
  Model normalizedModel;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_380;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_378;
  _Hash_node_base *local_360;
  SensorsList local_358 [16];
  _Hash_node_base *local_348;
  long *local_340 [2];
  long local_330 [2];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_320;
  undefined1 local_2e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8 [7];
  ios_base local_268 [264];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_160 [2];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_150 [5];
  
  this_00 = &this->m_model;
  local_320._M_buckets = &local_320._M_single_bucket;
  local_320._M_bucket_count = 1;
  local_320._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_320._M_element_count = 0;
  local_320._M_rehash_policy._M_max_load_factor = 1.0;
  local_320._M_rehash_policy._M_next_resize = 0;
  local_320._M_single_bucket = (__node_base_ptr)0x0;
  for (p_Var20 = (this->m_buffers).joints._M_h._M_before_begin._M_nxt;
      p_Var20 != (_Hash_node_base *)0x0; p_Var20 = p_Var20->_M_nxt) {
    local_2e8._0_8_ = &((key_type *)local_2e8)->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_2e8,p_Var20[1]._M_nxt,
               (long)&(p_Var20[2]._M_nxt)->_M_nxt + (long)p_Var20[1]._M_nxt);
    p_Var2 = p_Var20[5]._M_nxt;
    p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var20[6]._M_nxt;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    uVar9 = iDynTree::Model::getLinkIndex((string *)this_00);
    local_348 = p_Var20 + 0x11;
    uVar10 = iDynTree::Model::getLinkIndex((string *)this_00);
    (*(code *)p_Var2->_M_nxt[5]._M_nxt)(p_Var2,uVar9,uVar10);
    local_360 = p_Var2;
    plVar11 = (long *)__dynamic_cast(p_Var2,&IJoint::typeinfo,&RevoluteJoint::typeinfo,0);
    this_01 = p_Var3;
    if (plVar11 == (long *)0x0) {
      this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    if (plVar11 != (long *)0x0 && p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
        this_01 = p_Var3;
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        this_01 = p_Var3;
      }
    }
    if (plVar11 == (long *)0x0) {
      plVar11 = (long *)__dynamic_cast(local_360,&IJoint::typeinfo,&PrismaticJoint::typeinfo,0);
      local_380 = p_Var3;
      if (plVar11 == (long *)0x0) {
        local_380 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      if (plVar11 != (long *)0x0 && p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          UNLOCK();
          local_380 = p_Var3;
        }
        else {
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          local_380 = p_Var3;
        }
      }
      if (plVar11 == (long *)0x0) {
        iDynTree::reportError("URDFDocument","processJoints","Unrecognized joint type");
      }
      else {
        (**(code **)(*plVar11 + 0x128))(plVar11,p_Var20 + 7,uVar10);
      }
      if (local_380 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_380);
      }
    }
    else {
      (**(code **)(*plVar11 + 0x128))(plVar11,p_Var20 + 7,uVar10);
    }
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    }
    iDynTree::Model::addJoint((string *)this_00,(IJoint *)local_2e8);
    local_160[0] = &local_320;
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)local_160[0],local_348,local_160);
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._0_8_ != &((key_type *)local_2e8)->field_2) {
      operator_delete((void *)local_2e8._0_8_,local_2d8[0]._M_allocated_capacity + 1);
    }
  }
  p_Var20 = (this->m_buffers).fixedJoints._M_h._M_before_begin._M_nxt;
  if (p_Var20 != (_Hash_node_base *)0x0) {
    do {
      local_2e8._0_8_ = &((key_type *)local_2e8)->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_2e8,p_Var20[1]._M_nxt,
                 (long)&(p_Var20[2]._M_nxt)->_M_nxt + (long)p_Var20[1]._M_nxt);
      p_Var2 = p_Var20[5]._M_nxt;
      p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var20[6]._M_nxt;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        }
      }
      uVar9 = iDynTree::Model::getLinkIndex((string *)this_00);
      uVar10 = iDynTree::Model::getLinkIndex((string *)this_00);
      (*(code *)p_Var2->_M_nxt[5]._M_nxt)(p_Var2,uVar9,uVar10);
      iDynTree::Model::addJoint((string *)this_00,(IJoint *)local_2e8);
      local_160[0] = &local_320;
      std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)local_160[0],p_Var20 + 0x11,local_160);
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._0_8_ != &((key_type *)local_2e8)->field_2) {
        operator_delete((void *)local_2e8._0_8_,local_2d8[0]._M_allocated_capacity + 1);
      }
      p_Var20 = p_Var20->_M_nxt;
    } while (p_Var20 != (_Hash_node_base *)0x0);
  }
  local_378.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_378.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_378.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (uVar19 = 0; uVar12 = iDynTree::Model::getNrOfLinks(), uVar19 < uVar12; uVar19 = uVar19 + 1) {
    iDynTree::Model::getLinkName_abi_cxx11_((long)local_2e8);
    iVar13 = std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
             ::find(&local_320,(key_type *)local_2e8);
    if (iVar13.
        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_378,(key_type *)local_2e8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._0_8_ != &((key_type *)local_2e8)->field_2) {
      operator_delete((void *)local_2e8._0_8_,local_2d8[0]._M_allocated_capacity + 1);
    }
  }
  if (local_378.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_378.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    iDynTree::reportError("RobotElement","exitElementScope","No root link found in URDF string");
    iDynTree::Model::Model((Model *)local_2e8);
    iDynTree::Model::operator=(this_00,(Model *)local_2e8);
    iDynTree::Model::~Model((Model *)local_2e8);
  }
  else {
    if ((ulong)((long)local_378.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_378.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
      iDynTree::Model::getLinkIndex((string *)this_00);
      iDynTree::Model::setDefaultBaseLink((long)this_00);
      iDynTree::Model::Model((Model *)local_2e8);
      iDynTree::Model::Model((Model *)local_160);
      iDynTree::Model::getPackageDirs_abi_cxx11_();
      iDynTree::Model::setPackageDirs((vector *)local_2e8);
      iDynTree::Model::getPackageDirs_abi_cxx11_();
      iDynTree::Model::setPackageDirs((vector *)local_160);
      cVar6 = iDynTree::removeFakeLinks(this_00,(Model *)local_2e8);
      if (cVar6 == '\0') {
        iDynTree::reportError
                  ("URDFDocument","documentHasBeenParsed",
                   "Failed to remove fake links from the model");
        bVar22 = false;
      }
      else {
        iDynTree::Model::getDefaultBaseLink();
        iDynTree::Model::getLinkName_abi_cxx11_((long)local_340);
        cVar6 = iDynTree::createModelWithNormalizedJointNumbering
                          ((Model *)local_2e8,(string *)local_340,(Model *)local_160);
        if (cVar6 == '\0') {
          iDynTree::reportError
                    ("URDFDocument","documentHasBeenParsed",
                     "Failed to remove fake links from the model");
LAB_0012a0ec:
          bVar22 = false;
        }
        else {
          iDynTree::Model::operator=(this_00,(Model *)local_160);
          iDynTree::SensorsList::SensorsList(local_358);
          pSVar15 = (SensorsList *)iDynTree::Model::sensors();
          iDynTree::SensorsList::operator=(pSVar15,local_358);
          iDynTree::SensorsList::~SensorsList(local_358);
          psVar21 = (this->m_buffers).sensorHelpers.
                    super__Vector_base<std::shared_ptr<iDynTree::SensorHelper>,_std::allocator<std::shared_ptr<iDynTree::SensorHelper>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          psVar4 = (this->m_buffers).sensorHelpers.
                   super__Vector_base<std::shared_ptr<iDynTree::SensorHelper>,_std::allocator<std::shared_ptr<iDynTree::SensorHelper>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          bVar22 = psVar21 == psVar4;
          if (!bVar22) {
            do {
              peVar5 = (psVar21->
                       super___shared_ptr<iDynTree::SensorHelper,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr;
              iVar8 = (*peVar5->_vptr_SensorHelper[2])(peVar5,this_00);
              plVar11 = (long *)CONCAT44(extraout_var,iVar8);
              if (plVar11 == (long *)0x0) {
                iDynTree::SensorsList::SensorsList(local_358);
                pSVar15 = (SensorsList *)iDynTree::Model::sensors();
                iDynTree::SensorsList::operator=(pSVar15,local_358);
                iDynTree::SensorsList::~SensorsList(local_358);
                break;
              }
              pSVar16 = (Sensor *)iDynTree::Model::sensors();
              iDynTree::SensorsList::addSensor(pSVar16);
              (**(code **)(*plVar11 + 8))(plVar11);
              psVar21 = psVar21 + 1;
              bVar22 = psVar21 == psVar4;
            } while (!bVar22);
          }
          if ((!bVar22) ||
             (((this->m_options).addSensorFramesAsAdditionalFrames == true &&
              (bVar22 = addSensorFramesAsAdditionalFramesToModel(this_00), !bVar22))))
          goto LAB_0012a0ec;
          pMVar17 = (ModelSolidShapes *)iDynTree::Model::visualSolidShapes();
          materialDatabase = &(this->m_buffers).materials;
          bVar22 = addVisualPropertiesToModel
                             (this_00,&(this->m_buffers).visuals,materialDatabase,pMVar17);
          if (!bVar22) {
            iDynTree::reportError
                      ("URDFDocument","documentHasBeenParsed",
                       "Failed to add visual elements to model");
          }
          pMVar17 = (ModelSolidShapes *)iDynTree::Model::collisionSolidShapes();
          bVar7 = addVisualPropertiesToModel
                            (this_00,&(this->m_buffers).collisions,materialDatabase,pMVar17);
          bVar22 = true;
          if (!bVar7) {
            iDynTree::reportError
                      ("URDFDocument","documentHasBeenParsed",
                       "Failed to add collision elements to model");
          }
        }
        if (local_340[0] != local_330) {
          operator_delete(local_340[0],local_330[0] + 1);
        }
      }
      iDynTree::Model::~Model((Model *)local_160);
      iDynTree::Model::~Model((Model *)local_2e8);
      goto LAB_0012a123;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)local_2e8);
    poVar1 = (ostream *)&((key_type *)local_2e8)->field_2;
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Multiple (",10);
    poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,") root links: (",0xf);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,((local_378.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
               (local_378.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
    if (0x20 < (ulong)((long)local_378.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_378.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
      uVar12 = 1;
      lVar18 = 0x28;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar1,*(char **)((long)local_378.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start + lVar18 + -8),
                   *(long *)((long)&((local_378.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                            + lVar18));
        uVar12 = uVar12 + 1;
        lVar18 = lVar18 + 0x20;
      } while (uVar12 < (ulong)((long)local_378.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_378.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,") found in URDF string",0x16);
    std::__cxx11::stringbuf::str();
    iDynTree::reportError("RobotElement","exitElementScope",(char *)local_160[0]);
    if (local_160[0] != local_150) {
      operator_delete(local_160[0],(long)local_150[0]._M_buckets + 1);
    }
    iDynTree::Model::Model((Model *)local_160);
    iDynTree::Model::operator=(this_00,(Model *)local_160);
    iDynTree::Model::~Model((Model *)local_160);
    std::__cxx11::stringstream::~stringstream((stringstream *)local_2e8);
    std::ios_base::~ios_base(local_268);
  }
  bVar22 = false;
LAB_0012a123:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_378);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_320);
  return bVar22;
}

Assistant:

bool URDFDocument::documentHasBeenParsed()
    {
        // Maybe it is not the cleanest solution to process the model here,
        // but the after the scope is exited, the Model should be fully formed.
        // Add the joints to the model
        std::unordered_set<std::string> childLinks = processJoints(m_model,
                                                                   m_buffers.joints,
                                                                   m_buffers.fixedJoints);
        // Get root
        std::vector<std::string> rootCandidates;
        for(unsigned link = 0; link < m_model.getNrOfLinks(); ++link)
        {
            std::string linkName = m_model.getLinkName(link);
            if (childLinks.find(linkName) == childLinks.end() )
            {
                rootCandidates.push_back(linkName);
            }
        }

        if (rootCandidates.empty()) {
            reportError("RobotElement", "exitElementScope", "No root link found in URDF string");
            m_model = Model();
            return false;
        }

        if (rootCandidates.size() >= 2) {
            std::stringstream ss;
            ss << "Multiple (" << rootCandidates.size() << ") root links: (";
            ss << rootCandidates[0];
            for (size_t root = 1; root < rootCandidates.size(); ++root)
            {
                ss << ", " << rootCandidates[root];
            }
            ss << ") found in URDF string";

            reportError("RobotElement", "exitElementScope", ss.str().c_str());
            m_model = Model();
            return false;
        }

        // set the default root in the model
        m_model.setDefaultBaseLink(m_model.getLinkIndex(rootCandidates[0]));
        iDynTree::Model newModel, normalizedModel;
        newModel.setPackageDirs(m_model.getPackageDirs());
        normalizedModel.setPackageDirs(m_model.getPackageDirs());

        if (!removeFakeLinks(m_model, newModel)) {
            reportError("URDFDocument", "documentHasBeenParsed", "Failed to remove fake links from the model");
            return false;
        }

        std::string baseLinkName = newModel.getLinkName(newModel.getDefaultBaseLink());
        if (!createModelWithNormalizedJointNumbering(newModel, baseLinkName, normalizedModel)) {
            reportError("URDFDocument", "documentHasBeenParsed", "Failed to remove fake links from the model");
            return false;
        }

        m_model = normalizedModel;

        if (!processSensors(m_model, m_buffers.sensorHelpers))
        {
            //TODO: error
            return false;
        }

        if (m_options.addSensorFramesAsAdditionalFrames)
        {
            if (!addSensorFramesAsAdditionalFramesToModel(m_model)) {
                //TODO: error
                return false;
            }
        }

        // Assign visual properties to objects
        if (!addVisualPropertiesToModel(m_model,
                                        m_buffers.visuals,
                                        m_buffers.materials,
                                        m_model.visualSolidShapes())) {
            reportError("URDFDocument", "documentHasBeenParsed", "Failed to add visual elements to model");
        }
        if (!addVisualPropertiesToModel(m_model,
                                        m_buffers.collisions,
                                        m_buffers.materials,
                                        m_model.collisionSolidShapes())) {
            reportError("URDFDocument", "documentHasBeenParsed", "Failed to add collision elements to model");
        }

        return true;
    }